

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg3B1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint8 B3)

{
  code *pcVar1;
  uint8 B3_00;
  OpCode op_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot RVar3;
  RegSlot R2_00;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  FunctionBody *pFVar5;
  undefined7 in_register_00000089;
  RegSlot local_49;
  RegSlot local_45;
  RegSlot local_41;
  undefined1 local_3d;
  undefined4 local_3c;
  uint local_38;
  RegSlot local_34;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,B3);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xe);
  local_38 = (uint)CONCAT62(in_register_00000032,op);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x26e,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088df7e;
    *puVar4 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar5 = this->m_functionWrite;
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = R2;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088df7e;
      *puVar4 = 0;
      pFVar5 = this->m_functionWrite;
      R2 = local_34;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar5,R0);
    if (R1 != 0xffffffff) {
      pFVar5 = this->m_functionWrite;
      if (pFVar5 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        local_34 = R0_00;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0088df7e;
        *puVar4 = 0;
        pFVar5 = this->m_functionWrite;
        R0_00 = local_34;
      }
      RVar3 = FunctionBody::MapRegSlot(pFVar5,R1);
      if (R2 != 0xffffffff) {
        pFVar5 = this->m_functionWrite;
        local_34 = RVar3;
        if (pFVar5 != (FunctionBody *)0x0) {
LAB_0088de97:
          R2_00 = FunctionBody::MapRegSlot(pFVar5,R2);
          RVar3 = local_34;
          op_00 = (OpCode)local_38;
          B3_00 = (uint8)local_3c;
          local_38 = local_38 & 0xffff;
          bVar2 = TryWriteReg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                            (this,op_00,R0_00,local_34,R2_00,(uint8)local_3c);
          if (!bVar2) {
            bVar2 = TryWriteReg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,(OpCode)local_38,R0_00,RVar3,R2_00,B3_00);
            if (!bVar2) {
              local_45 = RVar3;
              local_3d = (undefined1)local_3c;
              local_49 = R0_00;
              local_41 = R2_00;
              Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_38,this);
              Data::Write(&this->m_byteCodeData,&local_49,0xd);
            }
          }
          return;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (bVar2) {
          *puVar4 = 0;
          pFVar5 = this->m_functionWrite;
          goto LAB_0088de97;
        }
        goto LAB_0088df7e;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_0088df7e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3B1(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint8 B3)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3B1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        MULTISIZE_LAYOUT_WRITE(Reg3B1, op, R0, R1, R2, B3);
    }